

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O1

double __thiscall sector_t::FindShortestUpperAround(sector_t *this)

{
  line_t_conflict *plVar1;
  FTextureID FVar2;
  long lVar3;
  FTexture *pFVar4;
  uint uVar5;
  long lVar6;
  double dVar7;
  double dVar8;
  
  dVar7 = 3.4028234663852886e+38;
  if (0 < (long)this->linecount) {
    dVar7 = 3.4028234663852886e+38;
    lVar3 = 0;
    do {
      plVar1 = this->lines[lVar3];
      if ((plVar1->flags & 4) != 0) {
        uVar5 = plVar1->sidedef[0]->textures[0].texture.texnum;
        lVar6 = (long)(int)uVar5;
        if ((0 < lVar6) || (lVar6 == 0 && (i_compatflags & 1U) != 0)) {
          if (uVar5 < TexMan.Textures.Count) {
            pFVar4 = TexMan.Textures.Array[lVar6].Texture;
          }
          else {
            pFVar4 = (FTexture *)0x0;
          }
          if ((pFVar4 != (FTexture *)0x0) &&
             (uVar5 = (uint)((double)((uint)pFVar4->Height * 2) / (pFVar4->Scale).Y),
             dVar8 = (double)(int)((uVar5 & 1) + ((int)uVar5 >> 1)), dVar8 < dVar7)) {
            dVar7 = dVar8;
          }
        }
        uVar5 = plVar1->sidedef[1]->textures[0].texture.texnum;
        lVar6 = (long)(int)uVar5;
        if ((0 < lVar6) || (lVar6 == 0 && (i_compatflags & 1U) != 0)) {
          if (uVar5 < TexMan.Textures.Count) {
            pFVar4 = TexMan.Textures.Array[lVar6].Texture;
          }
          else {
            pFVar4 = (FTexture *)0x0;
          }
          if ((pFVar4 != (FTexture *)0x0) &&
             (uVar5 = (uint)((double)((uint)pFVar4->Height * 2) / (pFVar4->Scale).Y),
             dVar8 = (double)(int)((uVar5 & 1) + ((int)uVar5 >> 1)), dVar8 < dVar7)) {
            dVar7 = dVar8;
          }
        }
      }
      lVar3 = lVar3 + 1;
    } while (this->linecount != lVar3);
  }
  if (3.4028234663852886e+38 <= dVar7) {
    FVar2 = FTextureManager::GetTexture(&TexMan,(char *)0x0,8,0);
    dVar7 = (double)(TexMan.Textures.Array[(uint)FVar2.texnum].Texture)->Height;
  }
  return dVar7;
}

Assistant:

double sector_t::FindShortestUpperAround () const
{
	double minsize = FLT_MAX;

	for (int i = 0; i < linecount; i++)
	{
		if (lines[i]->flags & ML_TWOSIDED)
		{
			CheckShortestTex (lines[i]->sidedef[0]->GetTexture(side_t::top), minsize);
			CheckShortestTex (lines[i]->sidedef[1]->GetTexture(side_t::top), minsize);
		}
	}
	return minsize < FLT_MAX ? minsize : TexMan[0]->GetHeight();
}